

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fTextureFormatTests.cpp
# Opt level: O2

int __thiscall
deqp::gles3::Functional::Compressed2DFormatCase::init
          (Compressed2DFormatCase *this,EVP_PKEY_CTX *ctx)

{
  deUint32 dVar1;
  int extraout_EAX;
  Texture2D *this_00;
  uint uVar2;
  ulong uVar3;
  ulong uVar4;
  TexDecompressionParams local_64;
  Random rnd;
  CompressedTexture compressedTexture;
  
  tcu::CompressedTexture::CompressedTexture
            (&compressedTexture,this->m_format,this->m_width,this->m_height,1);
  deRandom_init(&rnd.m_rnd,this->m_randomSeed);
  uVar2 = (int)compressedTexture.m_data.
               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_finish -
          (int)compressedTexture.m_data.
               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start;
  uVar4 = 0;
  uVar3 = (ulong)uVar2;
  if ((int)uVar2 < 1) {
    uVar3 = uVar4;
  }
  for (; uVar3 != uVar4; uVar4 = uVar4 + 1) {
    dVar1 = deRandom_getUint32(&rnd.m_rnd);
    compressedTexture.m_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
    _M_impl.super__Vector_impl_data._M_start[uVar4] = (uchar)dVar1;
  }
  this_00 = (Texture2D *)operator_new(0x70);
  local_64.astcMode = ASTCMODE_LAST;
  glu::Texture2D::Texture2D
            (this_00,this->m_renderCtx,this->m_renderCtxInfo,1,&compressedTexture,&local_64);
  this->m_texture = this_00;
  tcu::CompressedTexture::~CompressedTexture(&compressedTexture);
  return extraout_EAX;
}

Assistant:

void Compressed2DFormatCase::init (void)
{
	// Create texture.
	tcu::CompressedTexture	compressedTexture	(m_format, m_width, m_height);
	int						dataSize			= compressedTexture.getDataSize();
	deUint8*				data				= (deUint8*)compressedTexture.getData();
	de::Random				rnd					(m_randomSeed);

	for (int i = 0; i < dataSize; i++)
		data[i] = rnd.getUint32() & 0xff;

	m_texture = new glu::Texture2D(m_renderCtx, m_renderCtxInfo, 1, &compressedTexture);
}